

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argon2.c
# Opt level: O1

int argon2_hash(uint32_t t_cost,uint32_t m_cost,uint32_t parallelism,void *pwd,size_t pwdlen,
               void *salt,size_t saltlen,void *hash,size_t hashlen,char *encoded,size_t encodedlen,
               argon2_type type,uint32_t version)

{
  int iVar1;
  uint8_t *__src;
  argon2_context local_a8;
  
  if (pwdlen >> 0x20 != 0) {
    return -5;
  }
  if (saltlen >> 0x20 != 0) {
    return -7;
  }
  if (hashlen >> 0x20 != 0) {
    return -3;
  }
  if (3 < hashlen) {
    __src = (uint8_t *)malloc(hashlen);
    if (__src != (uint8_t *)0x0) {
      local_a8.outlen = (uint32_t)hashlen;
      local_a8.pwdlen = (uint32_t)pwdlen;
      local_a8.saltlen = (uint32_t)saltlen;
      local_a8.secret = (uint8_t *)0x0;
      local_a8.secretlen = 0;
      local_a8.ad = (uint8_t *)0x0;
      local_a8.adlen = 0;
      local_a8.allocate_cbk = (allocate_fptr)0x0;
      local_a8.free_cbk = (deallocate_fptr)0x0;
      local_a8.flags = 0;
      local_a8.version = version;
      local_a8.out = __src;
      local_a8.pwd = (uint8_t *)pwd;
      local_a8.salt = (uint8_t *)salt;
      local_a8.t_cost = t_cost;
      local_a8.m_cost = m_cost;
      local_a8.lanes = parallelism;
      local_a8.threads = parallelism;
      iVar1 = argon2_ctx_mem(&local_a8,type,(void *)0x0,0);
      if (iVar1 == 0) {
        if (hash != (void *)0x0) {
          memcpy(hash,__src,hashlen);
        }
        if ((encodedlen == 0 || encoded == (char *)0x0) ||
           (iVar1 = encode_string(encoded,encodedlen,&local_a8,type), iVar1 == 0)) {
          clear_internal_memory(__src,hashlen);
          iVar1 = 0;
        }
        else {
          clear_internal_memory(__src,hashlen);
          clear_internal_memory(encoded,encodedlen);
          iVar1 = -0x1f;
        }
      }
      else {
        clear_internal_memory(__src,hashlen);
      }
      free(__src);
      return iVar1;
    }
    return -0x16;
  }
  return -2;
}

Assistant:

int argon2_hash(const uint32_t t_cost, const uint32_t m_cost,
                const uint32_t parallelism, const void *pwd,
                const size_t pwdlen, const void *salt, const size_t saltlen,
                void *hash, const size_t hashlen, char *encoded,
                const size_t encodedlen, argon2_type type,
                const uint32_t version){

    argon2_context context;
    int result;
    uint8_t *out;

    if (pwdlen > ARGON2_MAX_PWD_LENGTH) {
        return ARGON2_PWD_TOO_LONG;
    }

    if (saltlen > ARGON2_MAX_SALT_LENGTH) {
        return ARGON2_SALT_TOO_LONG;
    }

    if (hashlen > ARGON2_MAX_OUTLEN) {
        return ARGON2_OUTPUT_TOO_LONG;
    }

    if (hashlen < ARGON2_MIN_OUTLEN) {
        return ARGON2_OUTPUT_TOO_SHORT;
    }

    out = malloc(hashlen);
    if (!out) {
        return ARGON2_MEMORY_ALLOCATION_ERROR;
    }

    context.out = (uint8_t *)out;
    context.outlen = (uint32_t)hashlen;
    context.pwd = CONST_CAST(uint8_t *)pwd;
    context.pwdlen = (uint32_t)pwdlen;
    context.salt = CONST_CAST(uint8_t *)salt;
    context.saltlen = (uint32_t)saltlen;
    context.secret = NULL;
    context.secretlen = 0;
    context.ad = NULL;
    context.adlen = 0;
    context.t_cost = t_cost;
    context.m_cost = m_cost;
    context.lanes = parallelism;
    context.threads = parallelism;
    context.allocate_cbk = NULL;
    context.free_cbk = NULL;
    context.flags = ARGON2_DEFAULT_FLAGS;
    context.version = version;

    result = argon2_ctx(&context, type);

    if (result != ARGON2_OK) {
        clear_internal_memory(out, hashlen);
        free(out);
        return result;
    }

    /* if raw hash requested, write it */
    if (hash) {
        memcpy(hash, out, hashlen);
    }

    /* if encoding requested, write it */
    if (encoded && encodedlen) {
        if (encode_string(encoded, encodedlen, &context, type) != ARGON2_OK) {
            clear_internal_memory(out, hashlen); /* wipe buffers if error */
            clear_internal_memory(encoded, encodedlen);
            free(out);
            return ARGON2_ENCODING_FAIL;
        }
    }
    clear_internal_memory(out, hashlen);
    free(out);

    return ARGON2_OK;
}